

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O0

void __thiscall SessionObjectStore::clearStore(SessionObjectStore *this)

{
  bool bVar1;
  reference ppSVar2;
  _Rb_tree_const_iterator<SessionObject_*> *in_RDI;
  iterator i;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> clearObjects;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff78;
  SessionObject *in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60 [12];
  
  MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::clear
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5c5b);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff80,
             (set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff78);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::clear
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5c7e);
  local_60[0]._M_node =
       (_Base_ptr)
       std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
       begin((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
         end((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(local_60,&local_68);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                        ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff80 = *ppSVar2;
    if (in_stack_ffffffffffffff80 != (SessionObject *)0x0) {
      (*(in_stack_ffffffffffffff80->super_OSObject)._vptr_OSObject[1])();
    }
    std::_Rb_tree_const_iterator<SessionObject_*>::operator++
              (in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::~set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5d0d);
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void SessionObjectStore::clearStore()
{
	MutexLocker lock(storeMutex);

	objects.clear();
	std::set<SessionObject*> clearObjects = allObjects;
	allObjects.clear();

	for (std::set<SessionObject*>::iterator i = clearObjects.begin(); i != clearObjects.end(); i++)
	{
		delete *i;
	}
}